

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall flatbuffers::Parser::Expect(Parser *this,int t)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  uint in_EDX;
  CheckedError *ce;
  undefined4 in_register_00000034;
  Parser *this_00;
  ulong uVar5;
  undefined8 uVar6;
  long *local_c0;
  long local_b0;
  undefined8 uStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  string local_80;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  string local_40;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,t);
  if ((this_00->super_ParserState).token_ == in_EDX) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    }
    goto LAB_00106834;
  }
  (anonymous_namespace)::TokenToString_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)(ulong)in_EDX,in_EDX);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x1509c9);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar1[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar3;
    local_60 = (long *)*plVar1;
  }
  local_58 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar4 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar4) {
    local_90 = *puVar4;
    lStack_88 = plVar1[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar4;
    local_a0 = (ulong *)*plVar1;
  }
  local_98 = plVar1[1];
  *plVar1 = (long)puVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  TokenToStringId_abi_cxx11_(&local_80,this_00,(this_00->super_ParserState).token_);
  uVar5 = 0xf;
  if (local_a0 != &local_90) {
    uVar5 = local_90;
  }
  if (uVar5 < local_80._M_string_length + local_98) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar6 = local_80.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_80._M_string_length + local_98) goto LAB_0010673e;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_a0);
  }
  else {
LAB_0010673e:
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80._M_dataplus._M_p);
  }
  local_c0 = &local_b0;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_b0 = *plVar1;
    uStack_a8 = puVar2[3];
  }
  else {
    local_b0 = *plVar1;
    local_c0 = (long *)*puVar2;
  }
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  Error(this,(string *)this_00);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
LAB_00106834:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Expect(int t) {
  if (t != token_) {
    return Error("expecting: " + TokenToString(t) +
                 " instead got: " + TokenToStringId(token_));
  }
  NEXT();
  return NoError();
}